

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O2

FBOCache * __thiscall
Diligent::RenderDeviceGLImpl::GetFBOCache(RenderDeviceGLImpl *this,NativeGLContextType Context)

{
  mapped_type *pmVar1;
  NativeGLContextType local_20;
  
  local_20 = Context;
  Threading::SpinLock::lock(&this->m_FBOCacheLock);
  pmVar1 = std::__detail::
           _Map_base<__GLXcontextRec_*,_std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>,_std::allocator<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>_>,_std::__detail::_Select1st,_std::equal_to<__GLXcontextRec_*>,_std::hash<__GLXcontextRec_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<__GLXcontextRec_*,_std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>,_std::allocator<std::pair<__GLXcontextRec_*const,_Diligent::FBOCache>_>,_std::__detail::_Select1st,_std::equal_to<__GLXcontextRec_*>,_std::hash<__GLXcontextRec_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->m_FBOCache,&local_20);
  Threading::SpinLock::unlock(&this->m_FBOCacheLock);
  return pmVar1;
}

Assistant:

FBOCache& RenderDeviceGLImpl::GetFBOCache(GLContext::NativeGLContextType Context)
{
    Threading::SpinLockGuard FBOCacheGuard{m_FBOCacheLock};
    return m_FBOCache[Context];
}